

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_net_methods.cpp
# Opt level: O0

void Marshall_list_proc(int the_socket,Am_Value *in_value,Am_Connection *my_connection_ptr)

{
  Am_List_Item *pAVar1;
  bool bVar2;
  unsigned_short uVar3;
  Am_Value *initial;
  Am_Value local_60 [2];
  Am_Value local_40;
  undefined1 local_30 [8];
  Am_Value_List in_list;
  Am_Connection *my_connection_ptr_local;
  Am_Value *in_value_local;
  int the_socket_local;
  
  in_list.item = (Am_List_Item *)my_connection_ptr;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30,in_value);
  pAVar1 = in_list.item;
  uVar3 = Am_Value_List::Length((Am_Value_List *)local_30);
  Am_Value::Am_Value(&local_40,(uint)uVar3);
  Am_Connection::Send((Am_Connection *)pAVar1,&local_40);
  Am_Value::~Am_Value(&local_40);
  Am_Value_List::Start((Am_Value_List *)local_30);
  while( true ) {
    bVar2 = Am_Value_List::Last((Am_Value_List *)local_30);
    pAVar1 = in_list.item;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    initial = Am_Value_List::Get((Am_Value_List *)local_30);
    Am_Value::Am_Value(local_60,initial);
    Am_Connection::Send((Am_Connection *)pAVar1,local_60);
    Am_Value::~Am_Value(local_60);
    Am_Value_List::Next((Am_Value_List *)local_30);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Marshall_Method, void, Marshall_list,
                 (int the_socket, const Am_Value &in_value,
                  Am_Connection *my_connection_ptr))
{
  (void)the_socket; // avoid warning
  Am_Value_List in_list = in_value;
  my_connection_ptr->Send(in_list.Length());
  for (in_list.Start(); !in_list.Last(); in_list.Next())
    my_connection_ptr->Send(in_list.Get());
}